

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclInvalidConstructors2<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclInvalidConstructors2<glcts::ArraysOfArrays::Interface::ES>
           *this,TestShaderType tested_shader_type)

{
  TestError *this_00;
  string *local_200;
  string local_148 [8];
  string shader_source;
  size_t invalid_initializers_index;
  allocator<char> local_118;
  allocator<char> local_117;
  allocator<char> local_116;
  allocator<char> local_115 [20];
  allocator<char> local_101;
  string *local_100;
  string local_f8 [8];
  string invalid_initializers [7];
  TestShaderType tested_shader_type_local;
  ConstructorsAndUnsizedDeclInvalidConstructors2<glcts::ArraysOfArrays::Interface::ES> *this_local;
  
  invalid_initializers_index._5_1_ = 1;
  local_100 = local_f8;
  invalid_initializers[6].field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"    int x[2][2][0]; \n",&local_101);
  local_100 = (string *)(invalid_initializers[0].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_initializers[0].field_2._M_local_buf + 8),"    int x[2][0][2]; \n",
             local_115);
  local_100 = (string *)(invalid_initializers[1].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_initializers[1].field_2._M_local_buf + 8),"    int x[0][2][2]; \n",
             &local_116);
  local_100 = (string *)(invalid_initializers[2].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_initializers[2].field_2._M_local_buf + 8),"    int x[2][0][0]; \n",
             &local_117);
  local_100 = (string *)(invalid_initializers[3].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_initializers[3].field_2._M_local_buf + 8),"    int x[0][2][0]; \n",
             &local_118);
  local_100 = (string *)(invalid_initializers[4].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_initializers[4].field_2._M_local_buf + 8),"    int x[0][0][2]; \n",
             (allocator<char> *)((long)&invalid_initializers_index + 7));
  local_100 = (string *)(invalid_initializers[5].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_initializers[5].field_2._M_local_buf + 8),"    int x[0][0][0]; \n",
             (allocator<char> *)((long)&invalid_initializers_index + 6));
  invalid_initializers_index._5_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)((long)&invalid_initializers_index + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&invalid_initializers_index + 7));
  std::allocator<char>::~allocator(&local_118);
  std::allocator<char>::~allocator(&local_117);
  std::allocator<char>::~allocator(&local_116);
  std::allocator<char>::~allocator(local_115);
  std::allocator<char>::~allocator(&local_101);
  for (shader_source.field_2._8_8_ = 0; (ulong)shader_source.field_2._8_8_ < 7;
      shader_source.field_2._8_8_ = shader_source.field_2._8_8_ + 1) {
    std::__cxx11::string::string(local_148);
    std::__cxx11::string::operator=(local_148,(string *)shader_start_abi_cxx11_);
    std::__cxx11::string::operator+=
              (local_148,
               (string *)
               (invalid_initializers[shader_source.field_2._8_8_ + -1].field_2._M_local_buf + 8));
    switch(invalid_initializers[6].field_2._12_4_) {
    case 0:
      break;
    case 1:
      std::__cxx11::string::operator+=(local_148,"\n\tgl_Position = vec4(0.0);\n");
      break;
    case 2:
      break;
    case 3:
      std::__cxx11::string::operator+=(local_148,(string *)emit_quad_abi_cxx11_);
      break;
    case 4:
      std::__cxx11::string::operator+=(local_148,(string *)set_tesseation_abi_cxx11_);
      break;
    case 5:
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x8ae);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=(local_148,(string *)shader_end_abi_cxx11_);
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode
      ._vptr_TestNode[8])(this,(ulong)(uint)invalid_initializers[6].field_2._12_4_,local_148);
    std::__cxx11::string::~string(local_148);
  }
  local_200 = (string *)(invalid_initializers[6].field_2._M_local_buf + 8);
  do {
    local_200 = local_200 + -0x20;
    std::__cxx11::string::~string(local_200);
  } while (local_200 != local_f8);
  return;
}

Assistant:

void ConstructorsAndUnsizedDeclInvalidConstructors2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string invalid_initializers[] = { "    int x[2][2][0]; \n", "    int x[2][0][2]; \n", "    int x[0][2][2]; \n",
										   "    int x[2][0][0]; \n", "    int x[0][2][0]; \n", "    int x[0][0][2]; \n",
										   "    int x[0][0][0]; \n" };

	for (size_t invalid_initializers_index = 0;
		 invalid_initializers_index < sizeof(invalid_initializers) / sizeof(invalid_initializers[0]);
		 invalid_initializers_index++)
	{
		std::string shader_source;

		shader_source = shader_start;
		shader_source += invalid_initializers[invalid_initializers_index];

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		this->execute_negative_test(tested_shader_type, shader_source);
	} /* for (int invalid_initializers_index = 0; ...) */
}